

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::NSolve(MLMG *this,MLMG *a_solver,MultiFab *a_sol,MultiFab *a_rhs)

{
  MLLinOp *pMVar1;
  FabArray<amrex::FArrayBox> *fa;
  Periodicity *period;
  MultiFab *pMVar2;
  initializer_list<amrex::MultiFab_*> __l;
  initializer_list<const_amrex::MultiFab_*> __l_00;
  allocator_type local_6a;
  allocator_type local_69;
  vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> local_68;
  vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> local_50;
  MultiFab *local_38;
  MultiFab *local_30;
  
  FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&a_sol->super_FabArray<amrex::FArrayBox>,0.0,0,
             (a_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
             &(a_sol->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
  fa = &Any::get<amrex::MultiFab>
                  ((((this->res).
                     super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                   super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                   super__Vector_impl_data._M_finish + -1)->super_FabArray<amrex::FArrayBox>;
  if (((a_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
       (fa->super_FabArrayBase).boxarray.m_ref.
       super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr) &&
     ((a_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (fa->super_FabArrayBase).distributionMap.m_ref.
      super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr)) {
    MultiFab::Copy(a_rhs,(MultiFab *)fa,0,0,
                   (a_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0);
  }
  else {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&a_rhs->super_FabArray<amrex::FArrayBox>,0.0,0,
               (a_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,
               &(a_rhs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow);
    period = Periodicity::NonPeriodic();
    FabArray<amrex::FArrayBox>::ParallelCopy
              (&a_rhs->super_FabArray<amrex::FArrayBox>,fa,period,COPY);
  }
  __l._M_len = 1;
  __l._M_array = &local_30;
  local_30 = a_sol;
  std::vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>::vector
            (&local_50,__l,&local_69);
  __l_00._M_len = 1;
  __l_00._M_array = &local_38;
  local_38 = a_rhs;
  std::vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
            (&local_68,__l_00,&local_6a);
  solve(a_solver,(Vector<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_> *)&local_50,
        (Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)&local_68,-1.0,
        -1.0,(char *)0x0);
  if (local_68.super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.
                    super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_50.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.
                          super__Vector_base<amrex::MultiFab_*,_std::allocator<amrex::MultiFab_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pMVar1 = this->linop;
  pMVar2 = Any::get<amrex::MultiFab>
                     ((((this->cor).
                        super_vector<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>,_std::allocator<amrex::Vector<amrex::Any,_std::allocator<amrex::Any>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_vector<amrex::Any,_std::allocator<amrex::Any>_>).
                      super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                      super__Vector_impl_data._M_finish + -1);
  (*pMVar1->_vptr_MLLinOp[0x26])(pMVar1,pMVar2,a_sol);
  return;
}

Assistant:

void
MLMG::NSolve (MLMG& a_solver, MultiFab& a_sol, MultiFab& a_rhs)
{
    BL_PROFILE("MLMG::NSolve()");

    a_sol.setVal(0.0);

    MultiFab const& res_bottom = res[0].back().get<MultiFab>();
    if (BoxArray::SameRefs(a_rhs.boxArray(),res_bottom.boxArray()) &&
        DistributionMapping::SameRefs(a_rhs.DistributionMap(),res_bottom.DistributionMap()))
    {
        MultiFab::Copy(a_rhs, res_bottom, 0, 0, a_rhs.nComp(), 0);
    } else {
        a_rhs.setVal(0.0);
        a_rhs.ParallelCopy(res_bottom);
    }

    a_solver.solve({&a_sol}, {&a_rhs}, Real(-1.0), Real(-1.0));

    linop.copyNSolveSolution(cor[0].back().get<MultiFab>(), a_sol);
}